

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O3

bufsize_t __thiscall SecurityDirWrapper::getSize(SecurityDirWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  offset_t oVar3;
  undefined4 extraout_var;
  bufsize_t bVar4;
  
  oVar3 = DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
  pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  bVar4 = 0xc;
  iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar1,oVar3,1,0xc,0);
  if ((uint *)CONCAT44(extraout_var,iVar2) == (uint *)0x0) {
    bVar4 = 0;
  }
  else if ((this->super_DataDirEntryWrapper).field_0x4c == '\x01') {
    bVar4 = (bufsize_t)*(uint *)CONCAT44(extraout_var,iVar2);
  }
  return bVar4;
}

Assistant:

bufsize_t SecurityDirWrapper::getSize()
{
    pe::WIN_CERTIFICATE* cert = getCert();
    if (cert == NULL) return 0;

    bufsize_t fullSize = static_cast<bufsize_t>(sizeof(pe::WIN_CERTIFICATE)); // TODO: check it
    if (this->sizeOk) {
        fullSize = static_cast<bufsize_t>(cert->dwLength);
    }
    return fullSize;
}